

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict
sexp_env_push_op(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,
                sexp_conflict name,sexp_conflict value)

{
  int iVar1;
  long lVar2;
  int *in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict tmp;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  int *local_28;
  undefined8 local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_40 = 0x43e;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_50,0,0x10);
  if ((((ulong)local_28 & 3) == 0) && (*local_28 == 0x17)) {
    iVar1 = sexp_idp(local_30);
    if (iVar1 == 0) {
      local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,7,local_30);
    }
    else {
      local_50 = &local_40;
      local_48 = *(undefined8 *)(local_10 + 0x6080);
      *(undefined8 ***)(local_10 + 0x6080) = &local_50;
      lVar2 = sexp_cons_op(local_10,0,2,local_30,local_38);
      *(undefined8 *)(lVar2 + 0x18) = *(undefined8 *)(local_28 + 6);
      *(long *)(local_28 + 6) = lVar2;
      *(undefined8 *)(local_10 + 0x6080) = local_48;
      local_8 = (sexp_conflict)0x43e;
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,0x17,local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_env_push_op (sexp ctx, sexp self, sexp_sint_t n, sexp env, sexp name, sexp value) {
  sexp_gc_var1(tmp);
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
  sexp_assert_type(ctx, sexp_idp, SEXP_SYMBOL, name);
  sexp_gc_preserve1(ctx, tmp);
  sexp_env_push(ctx, env, tmp, name, value);
  sexp_gc_release1(ctx);
  return SEXP_VOID;
}